

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnicodeText.Common.cpp
# Opt level: O2

int PlatformAgnostic::UnicodeText::Internal::readNumber<char16_t_const>(char16_t **str)

{
  code *pcVar1;
  char16_t *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  int iVar5;
  int iVar6;
  
  pcVar2 = *str;
  iVar6 = 0;
  while( true ) {
    if (9 < (ushort)(*pcVar2 + L'￐')) {
      return iVar6;
    }
    iVar5 = (uint)(ushort)*pcVar2 + iVar6 * 10 + -0x30;
    if (iVar5 <= iVar6) break;
    *str = pcVar2 + 1;
    pcVar2 = pcVar2 + 1;
    iVar6 = iVar5;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/PlatformAgnostic/Platform/Common/UnicodeText.Common.cpp"
                     ,0x3d,"(newNum > num)","newNum > num");
  if (bVar3) {
    *puVar4 = 0;
    return iVar6;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int readNumber(__inout CharType* &str)
            {
                int num = 0;

                // Count digits on each string
                while (isDigit(*str))
                {
                    int newNum = (num * 10) + (*str - '0');
                    Assert(newNum > num);
                    if (newNum <= num)
                    {
                        return num;
                    }

                    num = newNum;

                    str++;
                }

                return num;
            }